

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalCopyToFile::FinalizeInternal
          (PhysicalCopyToFile *this,ClientContext *context,GlobalSinkState *global_state)

{
  __pthread_internal_list *p_Var1;
  copy_to_finalize_t p_Var2;
  undefined8 uVar3;
  long lVar4;
  type global_lock_00;
  type pFVar5;
  type pGVar6;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> global_lock;
  undefined1 local_38 [16];
  
  if (this->partition_output == true) {
    CopyToFunctionGlobalState::FinalizePartitions
              ((CopyToFunctionGlobalState *)global_state,context,this);
  }
  else if (this->per_thread_output == true) {
    lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      (*(unsigned_long *)
                        ((long)&global_state[1].super_StateWithBlockableTasks.lock.
                                super___mutex_base._M_mutex + 8));
    if ((lVar4 == 0) &&
       ((this->super_PhysicalOperator).sink_state.
        super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
        .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl !=
        (GlobalSinkState *)0x0)) {
      StorageLock::GetExclusiveLock((StorageLock *)(local_38 + 8));
      global_lock_00 =
           unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator*(&(this->super_PhysicalOperator).sink_state);
      unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
      operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                 *)(local_38 + 8));
      CreateFileState((PhysicalCopyToFile *)local_38,(ClientContext *)this,
                      (GlobalSinkState *)context,(StorageLockKey *)global_lock_00);
      uVar3 = local_38._0_8_;
      local_38._0_8_ = (_func_int **)0x0;
      p_Var1 = global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data
               .__list.__prev;
      global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
      __prev = (__pthread_internal_list *)uVar3;
      if (p_Var1 != (__pthread_internal_list *)0x0) {
        (*(code *)p_Var1->__prev->__next)();
        if ((_func_int **)local_38._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_38._0_8_ + 8))();
        }
      }
      p_Var2 = (this->function).copy_to_finalize;
      pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*(&this->bind_data);
      pGVar6 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
               ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                            *)&global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base
                               ._M_mutex.__data.__list);
      (*p_Var2)(context,pFVar5,pGVar6);
      ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
      ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                   *)(local_38 + 8));
    }
  }
  else {
    p_Var2 = (this->function).copy_to_finalize;
    if ((p_Var2 != (copy_to_finalize_t)0x0) &&
       (global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
        .__prev != (__pthread_internal_list *)0x0)) {
      pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*(&this->bind_data);
      pGVar6 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
               ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                            *)&global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base
                               ._M_mutex.__data.__list);
      (*p_Var2)(context,pFVar5,pGVar6);
      if (this->use_tmp_file == true) {
        MoveTmpFile(context,&this->file_path);
      }
    }
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalCopyToFile::FinalizeInternal(ClientContext &context, GlobalSinkState &global_state) const {
	auto &gstate = global_state.Cast<CopyToFunctionGlobalState>();
	if (partition_output) {
		// finalize any outstanding partitions
		gstate.FinalizePartitions(context, *this);
		return SinkFinalizeType::READY;
	}
	if (per_thread_output) {
		// already happened in combine
		if (NumericCast<int64_t>(gstate.rows_copied.load()) == 0 && sink_state != nullptr) {
			// no rows from source, write schema to file
			auto global_lock = gstate.lock.GetExclusiveLock();
			gstate.global_state = CreateFileState(context, *sink_state, *global_lock);
			function.copy_to_finalize(context, *bind_data, *gstate.global_state);
		}
		return SinkFinalizeType::READY;
	}
	if (function.copy_to_finalize && gstate.global_state) {
		function.copy_to_finalize(context, *bind_data, *gstate.global_state);

		if (use_tmp_file) {
			D_ASSERT(!per_thread_output);
			D_ASSERT(!partition_output);
			D_ASSERT(!file_size_bytes.IsValid());
			D_ASSERT(!rotate);
			MoveTmpFile(context, file_path);
		}
	}
	return SinkFinalizeType::READY;
}